

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemoryBufferForStream
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,int FD,Twine *BufferName)

{
  uint uVar1;
  uint *puVar2;
  ssize_t sVar3;
  error_category *peVar4;
  undefined1 *__buf;
  StringRef InputData;
  error_code EC;
  SmallString<16384U> Buffer;
  SmallVectorBase local_4040;
  undefined1 local_4030 [16384];
  
  local_4040.BeginX = local_4030;
  local_4040.Size = 0;
  local_4040.Capacity = 0x4000;
  do {
    llvm::SmallVectorImpl<char>::reserve
              ((SmallVectorImpl<char> *)&local_4040,(ulong)local_4040.Size + 0x4000);
    __buf = (undefined1 *)((long)local_4040.BeginX + (ulong)local_4040.Size);
    puVar2 = (uint *)__errno_location();
    while( true ) {
      *puVar2 = 0;
      sVar3 = read(FD,__buf,0x4000);
      if (sVar3 != -1) break;
      uVar1 = *puVar2;
      if (uVar1 != 4) {
        peVar4 = (error_category *)std::_V2::generic_category();
        EC._4_4_ = 0;
        EC._M_value = uVar1;
        EC._M_cat = peVar4;
        llvm::
        ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
        ::ErrorOr(__return_storage_ptr__,EC);
        goto LAB_0011dab7;
      }
    }
    llvm::SmallVectorBase::set_size(&local_4040,(ulong)local_4040.Size + sVar3);
    if (sVar3 == 0) {
      InputData.Length._0_4_ = local_4040.Size;
      InputData.Data = (char *)local_4040.BeginX;
      InputData.Length._4_4_ = 0;
      getMemBufferCopyImpl(__return_storage_ptr__,InputData,BufferName);
LAB_0011dab7:
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_4040);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemoryBufferForStream(int FD, const Twine &BufferName) {
  const ssize_t ChunkSize = 4096*4;
  SmallString<ChunkSize> Buffer;
  ssize_t ReadBytes;
  // Read into Buffer until we hit EOF.
  do {
    Buffer.reserve(Buffer.size() + ChunkSize);
    ReadBytes = sys::RetryAfterSignal(-1, ::read, FD, Buffer.end(), ChunkSize);
    if (ReadBytes == -1)
      return std::error_code(errno, std::generic_category());
    Buffer.set_size(Buffer.size() + ReadBytes);
  } while (ReadBytes != 0);

  return getMemBufferCopyImpl(Buffer, BufferName);
}